

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::UpdateParser::~UpdateParser(UpdateParser *this)

{
  ~UpdateParser(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

UpdateParser(cmCTestBZR* bzr, const char* prefix): BZR(bzr)
    {
    this->SetLog(&bzr->Log, prefix);
    this->RegexUpdate.compile("^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
    }